

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date.cpp
# Opt level: O2

void duckdb::Date::ExtractISOYearWeek(date_t date,int32_t *year,int32_t *week)

{
  int iVar1;
  date_t dVar2;
  uint uVar3;
  int32_t local_30;
  int32_t month;
  
  Convert(date,year,&month,&local_30);
  dVar2 = GetISOWeekOne(*year);
  uVar3 = ((date.days - dVar2.days) % 7 >> 0x1f) + (date.days - dVar2.days) / 7;
  if ((int)uVar3 < 0) {
    iVar1 = *year;
    *year = iVar1 + -1;
    dVar2 = GetISOWeekOne(iVar1 + -1);
    uVar3 = ((date.days - dVar2.days) % 7 >> 0x1f) + (date.days - dVar2.days) / 7;
  }
  else if (0x33 < uVar3) {
    dVar2 = GetISOWeekOne(*year + 1);
    if (dVar2.days <= date.days) {
      *year = *year + 1;
      uVar3 = 0;
    }
  }
  *week = uVar3 + 1;
  return;
}

Assistant:

void Date::ExtractISOYearWeek(date_t date, int32_t &year, int32_t &week) {
	week = GetISOYearWeek(date, year);
}